

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::DirectStateAccess::VertexArrays::AttributeFormatErrorsTest::iterate
          (AttributeFormatErrorsTest *this)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  ContextInfo *this_00;
  GLuint i;
  int iStack_40;
  bool is_accepted_type;
  GLenum bad_type;
  GLint max_vertex_attrib_relative_offset;
  GLint max_vertex_attribs;
  GLuint not_a_vao;
  GLuint vao;
  bool is_error;
  bool is_ok;
  ApiType AStack_28;
  bool is_arb_direct_state_access;
  byte local_21;
  long lStack_20;
  bool is_at_least_gl_45;
  Functions *gl;
  AttributeFormatErrorsTest *this_local;
  
  gl = (Functions *)this;
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar4);
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  AStack_28.m_bits = (*pRVar6->_vptr_RenderContext[2])();
  vao = (GLuint)glu::ApiType::core(4,5);
  local_21 = glu::contextSupports((ContextType)AStack_28.m_bits,(ApiType)vao);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  not_a_vao._3_1_ = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if (((local_21 & 1) != 0) || ((bool)not_a_vao._3_1_)) {
    not_a_vao._2_1_ = 1;
    not_a_vao._1_1_ = 0;
    max_vertex_attribs = 0;
    max_vertex_attrib_relative_offset = 0;
    bad_type = 0x10;
    iStack_40 = 0x7ff;
    i = 0;
    bVar3 = true;
LAB_01204adf:
    if (bVar3) {
      i = i + 1;
      bVar3 = false;
      bVar1 = false;
      while (!bVar1) {
        if (i == 0x1400) {
          bVar3 = true;
          break;
        }
        bVar1 = true;
      }
      goto LAB_01204adf;
    }
    (**(code **)(lStack_20 + 0x410))(1,&max_vertex_attribs);
    dVar5 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar5,"glCreateVertexArrays call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x12b4);
    do {
      max_vertex_attrib_relative_offset = max_vertex_attrib_relative_offset + 1;
      cVar2 = (**(code **)(lStack_20 + 0xcd8))();
    } while (cVar2 != '\0');
    (**(code **)(lStack_20 + 0x868))(0x8869,&bad_type);
    (**(code **)(lStack_20 + 0x868))(0x82d9,&stack0xffffffffffffffc0);
    dVar5 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar5,"glGetIntegerv call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x12bd);
    (**(code **)(lStack_20 + 0x16a8))(max_vertex_attribs,bad_type,1,0x1400,0);
    bVar3 = CheckError(this,0x501,
                       "INVALID_VALUE was not generated by VertexArrayAttribFormat if attribindex is equal to the value of MAX_VERTEX_ATTRIBS."
                      );
    not_a_vao._2_1_ = bVar3 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x16a8))(max_vertex_attribs,bad_type + 1,1,0x1400,0);
    bVar3 = CheckError(this,0x501,
                       "INVALID_VALUE was not generated by VertexArrayAttribFormat if attribindex is greater than the value of MAX_VERTEX_ATTRIBS."
                      );
    not_a_vao._2_1_ = bVar3 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x16b0))(max_vertex_attribs,bad_type,1,0x1400,0);
    bVar3 = CheckError(this,0x501,
                       "INVALID_VALUE was not generated by VertexArrayAttribIFormat if attribindex is equal to the value of MAX_VERTEX_ATTRIBS."
                      );
    not_a_vao._2_1_ = bVar3 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x16b0))(max_vertex_attribs,bad_type + 1,1,0x1400,0);
    bVar3 = CheckError(this,0x501,
                       "INVALID_VALUE was not generated by VertexArrayAttribIFormat if attribindex is greater than the value of MAX_VERTEX_ATTRIBS."
                      );
    not_a_vao._2_1_ = bVar3 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x16b8))(max_vertex_attribs,bad_type,1,0x140a,0);
    bVar3 = CheckError(this,0x501,
                       "INVALID_VALUE was not generated by VertexArrayAttribLFormat if attribindex is equal to the value of MAX_VERTEX_ATTRIBS."
                      );
    not_a_vao._2_1_ = bVar3 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x16b8))(max_vertex_attribs,bad_type + 1,1,0x140a,0);
    bVar3 = CheckError(this,0x501,
                       "INVALID_VALUE was not generated by VertexArrayAttribLFormat if attribindex is greater than the value of MAX_VERTEX_ATTRIBS."
                      );
    not_a_vao._2_1_ = bVar3 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x16a8))(max_vertex_attribs,0,0,0x1400,0);
    bVar3 = CheckError(this,0x501,
                       "INVALID_VALUE was not generated by VertexArrayAttrib*Format if size is not one of the accepted values (0)."
                      );
    not_a_vao._2_1_ = bVar3 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x16a8))(max_vertex_attribs,0,5,0x1400,0);
    bVar3 = CheckError(this,0x501,
                       "INVALID_VALUE was not generated by VertexArrayAttrib*Format if size is not one of the accepted values (5)."
                      );
    not_a_vao._2_1_ = bVar3 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x16b0))(max_vertex_attribs,0,0,0x1400);
    bVar3 = CheckError(this,0x501,
                       "INVALID_VALUE was not generated by VertexArrayAttribIFormat if size is not one of the accepted values (0)."
                      );
    not_a_vao._2_1_ = bVar3 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x16b0))(max_vertex_attribs,0,5,0x1400);
    bVar3 = CheckError(this,0x501,
                       "INVALID_VALUE was not generated by VertexArrayAttribIFormat if size is not one of the accepted values (5)."
                      );
    not_a_vao._2_1_ = bVar3 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x16b8))(max_vertex_attribs,0,0,0x140a);
    bVar3 = CheckError(this,0x501,
                       "INVALID_VALUE was not generated by VertexArrayAttribLFormat if size is not one of the accepted values (0)."
                      );
    not_a_vao._2_1_ = bVar3 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x16b8))(max_vertex_attribs,0,5,0x140a);
    bVar3 = CheckError(this,0x501,
                       "INVALID_VALUE was not generated by VertexArrayAttribLFormat if size is not one of the accepted values (5)."
                      );
    not_a_vao._2_1_ = bVar3 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x16a8))(max_vertex_attribs,0,1,0x1400,0,iStack_40 + 1);
    bVar3 = CheckError(this,0x501,
                       "INVALID_VALUE was not generated by VertexArrayAttrib*Format if relativeoffset is greater than the value of MAX_VERTEX_ATTRIB_RELATIVE_OFFSET."
                      );
    not_a_vao._2_1_ = bVar3 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x16b0))(max_vertex_attribs,0,1,0x1400,iStack_40 + 1);
    bVar3 = CheckError(this,0x501,
                       "INVALID_VALUE was not generated by VertexArrayAttribIFormat if relativeoffset is greater than the value of MAX_VERTEX_ATTRIB_RELATIVE_OFFSET."
                      );
    not_a_vao._2_1_ = bVar3 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x16b8))(max_vertex_attribs,0,1,0x140a,iStack_40 + 1);
    bVar3 = CheckError(this,0x501,
                       "INVALID_VALUE was not generated by VertexArrayAttribLFormat if relativeoffset is greater than the value of MAX_VERTEX_ATTRIB_RELATIVE_OFFSET."
                      );
    not_a_vao._2_1_ = bVar3 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x16a8))(max_vertex_attribs,0,1,i,0);
    bVar3 = CheckError(this,0x500,
                       "INVALID_ENUM was not generated by VertexArrayAttribFormat if type is not one of the accepted tokens."
                      );
    not_a_vao._2_1_ = bVar3 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x16b0))(max_vertex_attribs,0,1,i);
    bVar3 = CheckError(this,0x500,
                       "INVALID_ENUM was not generated by VertexArrayAttribIFormat if type is not one of the accepted tokens."
                      );
    not_a_vao._2_1_ = bVar3 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x16b8))(max_vertex_attribs,0,1,i);
    bVar3 = CheckError(this,0x500,
                       "INVALID_ENUM was not generated by VertexArrayAttribLFormat if type is not one of the accepted tokens."
                      );
    not_a_vao._2_1_ = bVar3 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x16b0))(max_vertex_attribs,0,1,0x8c3b);
    bVar3 = CheckError(this,0x500,
                       "INVALID_ENUM was not generated by VertexArrayAttribIFormat if type is UNSIGNED_INT_10F_11F_11F_REV."
                      );
    not_a_vao._2_1_ = bVar3 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x16b8))(max_vertex_attribs,0,1,0x8c3b);
    bVar3 = CheckError(this,0x500,
                       "INVALID_ENUM was not generated by VertexArrayAttribLFormat if type is UNSIGNED_INT_10F_11F_11F_REV."
                      );
    not_a_vao._2_1_ = bVar3 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x16a8))(max_vertex_attrib_relative_offset,0,1,0x1400,0);
    bVar3 = CheckError(this,0x502,
                       "INVALID_OPERATION was not generated by VertexArrayAttribFormat if vaobj is not the name of an existing vertex array object."
                      );
    not_a_vao._2_1_ = bVar3 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x16b0))(max_vertex_attrib_relative_offset,0,1,0x1400);
    bVar3 = CheckError(this,0x502,
                       "INVALID_OPERATION was not generated by VertexArrayAttribIFormat if vaobj is not the name of an existing vertex array object."
                      );
    not_a_vao._2_1_ = bVar3 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x16b8))(max_vertex_attrib_relative_offset,0,1,0x140a);
    bVar3 = CheckError(this,0x502,
                       "INVALID_OPERATION was not generated by VertexArrayAttribLFormat if vaobj is not the name of an existing vertex array object."
                      );
    not_a_vao._2_1_ = bVar3 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x16a8))(max_vertex_attribs,0,0x80e1,0x1400,1);
    bVar3 = CheckError(this,0x502,
                       "INVALID_OPERATION was not generated by VertexArrayAttribFormat if size is BGRA and type is not UNSIGNED_BYTE, INT_2_10_10_10_REV or UNSIGNED_INT_2_10_10_10_REV."
                      );
    not_a_vao._2_1_ = bVar3 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x16a8))(max_vertex_attribs,0,1,0x8d9f);
    bVar3 = CheckError(this,0x502,
                       "INVALID_OPERATION was not generated by VertexArrayAttribFormat if type is INT_2_10_10_10_REV and size is neither 4 nor BGRA."
                      );
    not_a_vao._2_1_ = bVar3 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x16a8))(max_vertex_attribs,0,1,0x8368);
    bVar3 = CheckError(this,0x502,
                       "INVALID_OPERATION was not generated by VertexArrayAttribFormat if type is UNSIGNED_INT_2_10_10_10_REV and size is neither 4 nor BGRA."
                      );
    not_a_vao._2_1_ = bVar3 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x16a8))(max_vertex_attribs,0,1,0x8c3b);
    bVar3 = CheckError(this,0x502,
                       "INVALID_OPERATION was not generated by VertexArrayAttribFormat if type is UNSIGNED_INT_10F_11F_11F_REV and size is not 3."
                      );
    not_a_vao._2_1_ = bVar3 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0x16a8))(max_vertex_attribs,0,0x80e1,0x1401,0);
    bVar3 = CheckError(this,0x502,
                       "INVALID_OPERATION was not generated by VertexArrayAttribFormat if size is BGRA and normalized is FALSE."
                      );
    not_a_vao._2_1_ = (not_a_vao._2_1_ & 1 & bVar3) != 0;
    if (max_vertex_attribs != 0) {
      (**(code **)(lStack_20 + 0x490))(1);
    }
    do {
      iVar4 = (**(code **)(lStack_20 + 0x800))();
    } while (iVar4 != 0);
    if ((not_a_vao._2_1_ & 1) == 0) {
      if ((not_a_vao._1_1_ & 1) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_INTERNAL_ERROR,"Error");
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult AttributeFormatErrorsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Tested Objects. */
	glw::GLuint vao		  = 0;
	glw::GLuint not_a_vao = 0;

	/* Limits. (Minimum values - OpenGL 4.5 Core Specification, Table 23.55) */
	glw::GLint max_vertex_attribs				 = 16;
	glw::GLint max_vertex_attrib_relative_offset = 2047;

	/* Invalid values. */
	glw::GLenum bad_type = 0;

	static const glw::GLenum accepted_types[] = { GL_BYTE,
												  GL_SHORT,
												  GL_INT,
												  GL_FIXED,
												  GL_FLOAT,
												  GL_HALF_FLOAT,
												  GL_DOUBLE,
												  GL_UNSIGNED_BYTE,
												  GL_UNSIGNED_SHORT,
												  GL_UNSIGNED_INT,
												  GL_INT_2_10_10_10_REV,
												  GL_UNSIGNED_INT_2_10_10_10_REV,
												  GL_UNSIGNED_INT_10F_11F_11F_REV };

	{
		bool is_accepted_type = true;
		while (is_accepted_type)
		{
			bad_type++;
			is_accepted_type = false;
			for (glw::GLuint i = 0; i < sizeof(accepted_types) / sizeof(accepted_types); ++i)
			{
				if (accepted_types[i] == bad_type)
				{
					is_accepted_type = true;
					break;
				}
			}
		}
	}

	try
	{
		/* Prepare valid Objects. */
		gl.createVertexArrays(1, &vao);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateVertexArrays call failed.");

		/* Prepare invalid VAO. */
		while (gl.isVertexArray(++not_a_vao))
			;

		/* Prepare limits. */
		gl.getIntegerv(GL_MAX_VERTEX_ATTRIBS, &max_vertex_attribs);
		gl.getIntegerv(GL_MAX_VERTEX_ATTRIB_RELATIVE_OFFSET, &max_vertex_attrib_relative_offset);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv call failed.");

		/* TESTS OF VERTEXARRAYATTRIBFORMAT */

		/* MAX_VERTEX_ATTRIBS < */
		gl.vertexArrayAttribFormat(vao, max_vertex_attribs, 1, GL_BYTE, GL_FALSE, 0);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayAttribFormat if "
											  "attribindex is equal to the value of MAX_VERTEX_ATTRIBS.");

		gl.vertexArrayAttribFormat(vao, max_vertex_attribs + 1, 1, GL_BYTE, GL_FALSE, 0);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayAttribFormat if "
											  "attribindex is greater than the value of MAX_VERTEX_ATTRIBS.");

		gl.vertexArrayAttribIFormat(vao, max_vertex_attribs, 1, GL_BYTE, 0);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayAttribIFormat if "
											  "attribindex is equal to the value of MAX_VERTEX_ATTRIBS.");

		gl.vertexArrayAttribIFormat(vao, max_vertex_attribs + 1, 1, GL_BYTE, 0);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayAttribIFormat if "
											  "attribindex is greater than the value of MAX_VERTEX_ATTRIBS.");

		gl.vertexArrayAttribLFormat(vao, max_vertex_attribs, 1, GL_DOUBLE, 0);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayAttribLFormat if "
											  "attribindex is equal to the value of MAX_VERTEX_ATTRIBS.");

		gl.vertexArrayAttribLFormat(vao, max_vertex_attribs + 1, 1, GL_DOUBLE, 0);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayAttribLFormat if "
											  "attribindex is greater than the value of MAX_VERTEX_ATTRIBS.");

		/* size */
		gl.vertexArrayAttribFormat(vao, 0, 0, GL_BYTE, GL_FALSE, 0);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayAttrib*Format if size is "
											  "not one of the accepted values (0).");

		gl.vertexArrayAttribFormat(vao, 0, 5, GL_BYTE, GL_FALSE, 0);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayAttrib*Format if size is "
											  "not one of the accepted values (5).");

		gl.vertexArrayAttribIFormat(vao, 0, 0, GL_BYTE, 0);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayAttribIFormat if size is "
											  "not one of the accepted values (0).");

		gl.vertexArrayAttribIFormat(vao, 0, 5, GL_BYTE, 0);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayAttribIFormat if size is "
											  "not one of the accepted values (5).");

		gl.vertexArrayAttribLFormat(vao, 0, 0, GL_DOUBLE, 0);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayAttribLFormat if size is "
											  "not one of the accepted values (0).");

		gl.vertexArrayAttribLFormat(vao, 0, 5, GL_DOUBLE, 0);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayAttribLFormat if size is "
											  "not one of the accepted values (5).");

		/* relative offset */
		gl.vertexArrayAttribFormat(vao, 0, 1, GL_BYTE, GL_FALSE, max_vertex_attrib_relative_offset + 1);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayAttrib*Format if "
											  "relativeoffset is greater than the value of "
											  "MAX_VERTEX_ATTRIB_RELATIVE_OFFSET.");

		gl.vertexArrayAttribIFormat(vao, 0, 1, GL_BYTE, max_vertex_attrib_relative_offset + 1);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayAttribIFormat if "
											  "relativeoffset is greater than the value of "
											  "MAX_VERTEX_ATTRIB_RELATIVE_OFFSET.");

		gl.vertexArrayAttribLFormat(vao, 0, 1, GL_DOUBLE, max_vertex_attrib_relative_offset + 1);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayAttribLFormat if "
											  "relativeoffset is greater than the value of "
											  "MAX_VERTEX_ATTRIB_RELATIVE_OFFSET.");

		/* type */
		gl.vertexArrayAttribFormat(vao, 0, 1, bad_type, GL_FALSE, 0);

		is_ok &= CheckError(
			GL_INVALID_ENUM,
			"INVALID_ENUM was not generated by VertexArrayAttribFormat if type is not one of the accepted tokens.");

		gl.vertexArrayAttribIFormat(vao, 0, 1, bad_type, 0);

		is_ok &= CheckError(
			GL_INVALID_ENUM,
			"INVALID_ENUM was not generated by VertexArrayAttribIFormat if type is not one of the accepted tokens.");

		gl.vertexArrayAttribLFormat(vao, 0, 1, bad_type, 0);

		is_ok &= CheckError(
			GL_INVALID_ENUM,
			"INVALID_ENUM was not generated by VertexArrayAttribLFormat if type is not one of the accepted tokens.");

		/* type UNSIGNED_INT_10F_11F_11F_REV case */
		gl.vertexArrayAttribIFormat(vao, 0, 1, GL_UNSIGNED_INT_10F_11F_11F_REV, 0);

		is_ok &= CheckError(
			GL_INVALID_ENUM,
			"INVALID_ENUM was not generated by VertexArrayAttribIFormat if type is UNSIGNED_INT_10F_11F_11F_REV.");

		gl.vertexArrayAttribLFormat(vao, 0, 1, GL_UNSIGNED_INT_10F_11F_11F_REV, 0);

		is_ok &= CheckError(
			GL_INVALID_ENUM,
			"INVALID_ENUM was not generated by VertexArrayAttribLFormat if type is UNSIGNED_INT_10F_11F_11F_REV.");

		/* Test not a VAO. */
		gl.vertexArrayAttribFormat(not_a_vao, 0, 1, GL_BYTE, GL_FALSE, 0);

		is_ok &= CheckError(GL_INVALID_OPERATION, "INVALID_OPERATION was not generated by VertexArrayAttribFormat if "
												  "vaobj is not the name of an existing vertex array object.");

		gl.vertexArrayAttribIFormat(not_a_vao, 0, 1, GL_BYTE, 0);

		is_ok &= CheckError(GL_INVALID_OPERATION, "INVALID_OPERATION was not generated by VertexArrayAttribIFormat if "
												  "vaobj is not the name of an existing vertex array object.");

		gl.vertexArrayAttribLFormat(not_a_vao, 0, 1, GL_DOUBLE, 0);

		is_ok &= CheckError(GL_INVALID_OPERATION, "INVALID_OPERATION was not generated by VertexArrayAttribLFormat if "
												  "vaobj is not the name of an existing vertex array object.");

		/* BGRA */
		gl.vertexArrayAttribFormat(vao, 0, GL_BGRA, GL_BYTE, GL_TRUE, 0);

		is_ok &= CheckError(GL_INVALID_OPERATION, "INVALID_OPERATION was not generated by VertexArrayAttribFormat if "
												  "size is BGRA and type is not UNSIGNED_BYTE, INT_2_10_10_10_REV or "
												  "UNSIGNED_INT_2_10_10_10_REV.");

		gl.vertexArrayAttribFormat(vao, 0, 1, GL_INT_2_10_10_10_REV, GL_TRUE, 0);

		is_ok &= CheckError(GL_INVALID_OPERATION, "INVALID_OPERATION was not generated by VertexArrayAttribFormat if "
												  "type is INT_2_10_10_10_REV and size is neither 4 nor BGRA.");

		gl.vertexArrayAttribFormat(vao, 0, 1, GL_UNSIGNED_INT_2_10_10_10_REV, GL_TRUE, 0);

		is_ok &=
			CheckError(GL_INVALID_OPERATION, "INVALID_OPERATION was not generated by VertexArrayAttribFormat if type "
											 "is UNSIGNED_INT_2_10_10_10_REV and size is neither 4 nor BGRA.");

		gl.vertexArrayAttribFormat(vao, 0, 1, GL_UNSIGNED_INT_10F_11F_11F_REV, GL_TRUE, 0);

		is_ok &= CheckError(GL_INVALID_OPERATION, "INVALID_OPERATION was not generated by VertexArrayAttribFormat if "
												  "type is UNSIGNED_INT_10F_11F_11F_REV and size is not 3.");

		gl.vertexArrayAttribFormat(vao, 0, GL_BGRA, GL_UNSIGNED_BYTE, GL_FALSE, 0);

		is_ok &= CheckError(
			GL_INVALID_OPERATION,
			"INVALID_OPERATION was not generated by VertexArrayAttribFormat if size is BGRA and normalized is FALSE.");
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Clean up. */
	if (vao)
	{
		gl.deleteVertexArrays(1, &vao);
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}